

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ObjComputeBestCut(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge,int fEla)

{
  word *pwVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  word wVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  word *__src;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  word *pwVar18;
  word *pCut;
  int iVar19;
  size_t __size;
  float fVar20;
  float fVar21;
  
  pGVar3 = p->pGia->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->pGia->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar16 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
  if ((-1 < (int)uVar16) && ((int)uVar16 < (p->vCuts).nSize)) {
    uVar10 = uVar16 & 0x7fffffff;
    uVar15 = (p->vCuts).pArray[uVar10];
    pwVar18 = (p->pMem).pPages[(int)uVar15 >> ((byte)(p->pMem).nPageSize & 0x1f)];
    lVar8 = (long)(int)(uVar15 & (p->pMem).uPageMask);
    pwVar1 = pwVar18 + lVar8;
    pwVar18 = (word *)((long)pwVar18 + lVar8 * 8 + 4);
    iVar19 = 1000000000;
    iVar13 = 0;
    fVar21 = 1e+09;
    iVar17 = 1000000000;
    __src = (word *)0x0;
    pCut = pwVar18;
    do {
      uVar15 = (uint)*pCut;
      uVar11 = uVar15 & 0xf;
      if (uVar11 == 1) {
        if ((int)*(uint *)((long)pCut + 4) < 0) goto LAB_0075d4e2;
        if (*(uint *)((long)pCut + 4) >> 1 != uVar16) goto LAB_0075d1d0;
      }
      else {
LAB_0075d1d0:
        if (fEla == 0 && fEdge != 0) {
          uVar15 = uVar15 & 0xffffff0f | uVar11 << 4;
          *(uint *)pCut = uVar15;
LAB_0075d222:
          if (uVar11 == 0) {
            fVar20 = 0.0;
          }
          else {
            fVar20 = 0.0;
            uVar12 = 0;
            do {
              uVar14 = *(uint *)((long)pCut + uVar12 * 4 + 4);
              if ((int)uVar14 < 0) goto LAB_0075d4e2;
              uVar14 = uVar14 >> 1;
              if ((p->vFlow).nSize <= (int)uVar14) goto LAB_0075d501;
              fVar20 = fVar20 + (p->vFlow).pArray[uVar14];
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
            if (fVar20 < 0.0) {
              __assert_fail("Flow >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                            ,0x21b,"float Jf_CutFlow(Jf_Man_t *, int *)");
            }
          }
          fVar20 = (float)(uVar15 >> 4 & 0xf) + fVar20;
        }
        else {
          if (fEla == 0) goto LAB_0075d222;
          p->vTemp->nSize = 0;
          if (fEdge == 0) {
            iVar7 = Jf_CutAreaRef_rec(p,(int *)pCut);
          }
          else {
            iVar7 = Jf_CutAreaRefEdge_rec(p,(int *)pCut);
          }
          pVVar4 = p->vTemp;
          if (0 < pVVar4->nSize) {
            piVar9 = pVVar4->pArray;
            piVar5 = p->pGia->pRefs;
            lVar8 = 0;
            do {
              piVar2 = piVar5 + piVar9[lVar8];
              *piVar2 = *piVar2 + -1;
              lVar8 = lVar8 + 1;
            } while (lVar8 < pVVar4->nSize);
          }
          fVar20 = (float)iVar7;
        }
        if ((__src == (word *)0x0) || (fVar20 + 0.005 < fVar21)) {
LAB_0075d306:
          iVar19 = iVar17;
          __src = pCut;
          fVar21 = fVar20;
          iVar17 = iVar19;
        }
        else if (fVar20 + -0.005 < fVar21) {
          if (((uint)*pCut & 0xf) == 0) {
            iVar17 = 1;
          }
          else {
            uVar12 = 0;
            iVar17 = 0;
            do {
              uVar15 = *(uint *)((long)pCut + uVar12 * 4 + 4);
              if ((int)uVar15 < 0) goto LAB_0075d4e2;
              uVar15 = uVar15 >> 1;
              if ((p->vArr).nSize <= (int)uVar15) goto LAB_0075d520;
              iVar7 = (p->vArr).pArray[uVar15];
              if (iVar17 <= iVar7) {
                iVar17 = iVar7;
              }
              uVar12 = uVar12 + 1;
            } while (((uint)*pCut & 0xf) != uVar12);
            iVar17 = iVar17 + 1;
          }
          if (iVar17 < iVar19) goto LAB_0075d306;
        }
      }
      iVar13 = iVar13 + 1;
      pCut = (word *)((long)pCut + (ulong)((uint)*pCut & 0xf) * 4 + 4);
    } while (iVar13 < (int)(uint)*pwVar1);
    if (((uint)*__src & 0xf) == 0) {
      iVar17 = (p->vArr).nSize;
      iVar13 = 1;
    }
    else {
      uVar12 = 0;
      iVar13 = 0;
      do {
        uVar15 = *(uint *)((long)__src + uVar12 * 4 + 4);
        if ((int)uVar15 < 0) {
LAB_0075d4e2:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar15 = uVar15 >> 1;
        iVar17 = (p->vArr).nSize;
        if (iVar17 <= (int)uVar15) goto LAB_0075d520;
        iVar19 = (p->vArr).pArray[uVar15];
        if (iVar13 <= iVar19) {
          iVar13 = iVar19;
        }
        uVar12 = uVar12 + 1;
      } while (((uint)*__src & 0xf) != uVar12);
      iVar13 = iVar13 + 1;
    }
    if (iVar17 <= (int)uVar16) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (p->vArr).pArray[uVar10] = iVar13;
    if (fEla == 0) {
      if ((p->vRefs).nSize <= (int)uVar16) {
LAB_0075d501:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      if ((p->vFlow).nSize <= (int)uVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      (p->vFlow).pArray[uVar10] = fVar21 / (p->vRefs).pArray[uVar10];
    }
    if (__src <= pwVar1) {
      __assert_fail("pCuts < pCut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x1ff,"void Jf_ObjSetBestCut(int *, int *, Vec_Int_t *)");
    }
    if (__src <= pwVar18) {
      return;
    }
    pVVar4 = p->vTemp;
    uVar12 = (long)__src - (long)pwVar18;
    wVar6 = *__src;
    piVar9 = pVVar4->pArray;
    iVar17 = (int)(uVar12 >> 2);
    if (pVVar4->nCap < iVar17) {
      __size = (long)(uVar12 * 0x40000000) >> 0x1e & 0xfffffffffffffffc;
      if (piVar9 == (int *)0x0) {
        piVar9 = (int *)malloc(__size);
      }
      else {
        piVar9 = (int *)realloc(piVar9,__size);
      }
      pVVar4->pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = iVar17;
    }
    else {
      __size = (long)(uVar12 * 0x40000000) >> 0x1e & 0xfffffffffffffffc;
    }
    memmove(piVar9,pwVar18,__size);
    uVar12 = (ulong)((((uint)wVar6 & 0xf) + 1) * 4);
    memmove(pwVar18,__src,uVar12);
    memmove((void *)((long)pwVar18 + uVar12),pVVar4->pArray,__size);
    return;
  }
LAB_0075d520:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Jf_ObjComputeBestCut( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge, int fEla )
{
    int i, iObj = Gia_ObjId( p->pGia, pObj );
    int * pCuts = Jf_ObjCuts( p, iObj );
    int * pCut, * pCutBest = NULL;
    int Time = ABC_INFINITY, TimeBest = ABC_INFINITY;
    float Area, AreaBest = ABC_INFINITY;
    Jf_ObjForEachCut( pCuts, pCut, i )
    {
        if ( Jf_CutIsTriv(pCut, iObj) ) continue;
        if ( fEdge && !fEla ) 
            Jf_CutSetCost(pCut, Jf_CutSize(pCut));
        Area = fEla ? Jf_CutArea(p, pCut, fEdge) : Jf_CutFlow(p, pCut) + Jf_CutCost(pCut);
        if ( pCutBest == NULL || AreaBest > Area + JF_EPSILON || (AreaBest > Area - JF_EPSILON && TimeBest > (Time = Jf_CutArr(p, pCut))) )
            pCutBest = pCut, AreaBest = Area, TimeBest = Time;
    }
    Vec_IntWriteEntry( &p->vArr,  iObj, Jf_CutArr(p, pCutBest) );
    if ( !fEla )
    Vec_FltWriteEntry( &p->vFlow, iObj, AreaBest / Jf_ObjRefs(p, iObj) );
    Jf_ObjSetBestCut( pCuts, pCutBest, p->vTemp );
//    Jf_CutPrint( Jf_ObjCutBest(p, iObj) ); printf( "\n" );
}